

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O3

int ImportYUVAFromRGBA(uint8_t *r_ptr,uint8_t *g_ptr,uint8_t *b_ptr,uint8_t *a_ptr,int step,
                      int rgb_stride,float dithering,int use_iterative_conversion,
                      WebPPicture *picture)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  uint width;
  uint uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint8_t *v_ptr;
  bool bVar10;
  WebPEncCSP WVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  SharpYuvConversionMatrix *yuv_matrix;
  uint16_t *dst;
  long lVar15;
  _func_void_uint8_t_ptr_uint8_t_ptr_int **pp_Var16;
  ulong uVar17;
  long lVar18;
  uint8_t *puVar19;
  int v;
  int iVar20;
  long lVar21;
  ulong uVar22;
  int iVar23;
  int iVar24;
  uint32_t *puVar25;
  uint16_t *puVar26;
  int *piVar27;
  uint8_t *puVar28;
  VP8Random *rg;
  bool bVar29;
  double dVar30;
  uint8_t *local_1d0;
  uint8_t *local_1b8;
  uint8_t *local_1b0;
  uint8_t *local_198;
  uint8_t *local_190;
  uint8_t *local_168;
  uint8_t *local_160;
  VP8Random base_rg;
  
  width = picture->width;
  uVar22 = (ulong)width;
  uVar7 = picture->height;
  iVar13 = 0;
  bVar29 = true;
  if (a_ptr == (uint8_t *)0x0) {
    WVar11 = WEBP_YUV420;
  }
  else {
    WebPInitAlphaProcessing();
    WVar11 = WEBP_YUV420;
    if (step == 1) {
      if ((int)uVar7 < 1) goto LAB_0012a447;
      iVar20 = uVar7 + 1;
      puVar28 = a_ptr;
      do {
        iVar12 = (*WebPHasAlpha8b)(puVar28,width);
        bVar29 = iVar12 == 0;
        if (!bVar29) goto LAB_0012a42d;
        puVar28 = puVar28 + rgb_stride;
        iVar20 = iVar20 + -1;
      } while (1 < iVar20);
    }
    else {
      if ((int)uVar7 < 1) goto LAB_0012a447;
      iVar20 = uVar7 + 1;
      puVar28 = a_ptr;
      do {
        iVar12 = (*WebPHasAlpha32b)(puVar28,width);
        bVar29 = iVar12 == 0;
        if (!bVar29) goto LAB_0012a42d;
        puVar28 = puVar28 + rgb_stride;
        iVar20 = iVar20 + -1;
      } while (1 < iVar20);
    }
    WVar11 = WEBP_YUV420;
  }
  goto LAB_0012a447;
LAB_0012a42d:
  WVar11 = WEBP_CSP_ALPHA_BIT;
LAB_0012a447:
  picture->colorspace = WVar11;
  picture->use_argb = 0;
  iVar20 = WebPPictureAllocYUVA(picture);
  if (iVar20 != 0) {
    if (((use_iterative_conversion == 0) || ((int)width < 4)) || ((int)uVar7 < 4)) {
      uVar14 = (int)(width + 1) >> 1;
      dst = (uint16_t *)WebPSafeMalloc((long)(int)(uVar14 * 4),2);
      local_198 = picture->y;
      local_168 = picture->u;
      local_190 = picture->v;
      local_160 = picture->a;
      rg = (VP8Random *)0x0;
      bVar10 = dithering <= 0.0;
      if (bVar10) {
        puVar25 = (uint32_t *)&working_state_free_in_buffer;
      }
      else {
        puVar25 = base_rg.tab;
        rg = &base_rg;
        VP8InitRandom(rg,dithering);
      }
      WebPInitConvertARGBToYUV();
      iVar13 = pthread_mutex_lock((pthread_mutex_t *)InitGammaTables_InitGammaTables_body_lock);
      if (iVar13 == 0) {
        if (((VP8CPUInfo)InitGammaTables_InitGammaTables_body_last_cpuinfo_used != VP8GetCPUInfo) &&
           (kGammaTablesOk == 0)) {
          puVar26 = kGammaToLinearTab;
          lVar21 = 0;
          do {
            dVar30 = pow((double)(int)lVar21 * 0.00392156862745098,0.8);
            *puVar26 = (uint16_t)(int)(dVar30 * 4095.0 + 0.5);
            lVar21 = lVar21 + 1;
            puVar26 = puVar26 + 1;
          } while (lVar21 != 0x100);
          piVar27 = kLinearToGammaTab;
          lVar21 = 0;
          do {
            dVar30 = pow((double)(int)lVar21 * 0.03125763125763126,1.25);
            *piVar27 = (int)(dVar30 * 255.0 + 0.5);
            lVar21 = lVar21 + 1;
            piVar27 = piVar27 + 1;
          } while (lVar21 != 0x21);
          kGammaTablesOk = 1;
        }
        InitGammaTables_InitGammaTables_body_last_cpuinfo_used = VP8GetCPUInfo;
        pthread_mutex_unlock((pthread_mutex_t *)InitGammaTables_InitGammaTables_body_lock);
      }
      if (dst == (uint16_t *)0x0) {
        iVar13 = WebPEncodingSetError(picture,VP8_ENC_ERROR_OUT_OF_MEMORY);
        return iVar13;
      }
      puVar28 = r_ptr;
      local_1d0 = b_ptr;
      local_1b8 = a_ptr;
      local_1b0 = g_ptr;
      if (0 < (int)uVar7 >> 1) {
        lVar15 = (long)(rgb_stride * 2);
        iVar13 = 0;
        lVar21 = 0;
        if (!bVar29) {
          lVar21 = lVar15;
        }
        if (r_ptr < b_ptr) {
          pp_Var16 = &WebPConvertRGB24ToY;
        }
        else {
          pp_Var16 = &WebPConvertBGR24ToY;
        }
        do {
          if (!bVar10 || step != 3) {
            if (0 < (int)width) {
              uVar17 = 0;
              lVar18 = 0;
              do {
                bVar1 = puVar28[lVar18];
                bVar2 = local_1b0[lVar18];
                bVar3 = local_1d0[lVar18];
                if (rg == (VP8Random *)0x0) {
                  iVar20 = (uint)bVar3 * 0x1914 + (uint)bVar2 * 0x8123 + (uint)bVar1 * 0x41c7;
                }
                else {
                  uVar8 = puVar25[rg->index1];
                  uVar9 = puVar25[rg->index2];
                  iVar20 = rg->amp;
                  puVar25[rg->index1] = uVar8 - uVar9 & 0x7fffffff;
                  iVar12 = rg->index1 + 1;
                  if (iVar12 == 0x37) {
                    iVar12 = 0;
                  }
                  rg->index1 = iVar12;
                  iVar12 = rg->index2 + 1;
                  if (iVar12 == 0x37) {
                    iVar12 = 0;
                  }
                  rg->index2 = iVar12;
                  iVar20 = (uint)bVar3 * 0x1914 + (uint)bVar2 * 0x8123 + (uint)bVar1 * 0x41c7 +
                           ((short)(uVar8 - uVar9 >> 0xf) * iVar20 >> 8);
                }
                local_198[uVar17] = (uint8_t)((uint)(iVar20 + 0x108000) >> 0x10);
                uVar17 = uVar17 + 1;
                lVar18 = lVar18 + step;
              } while (uVar22 != uVar17);
              iVar20 = picture->y_stride;
              uVar17 = 0;
              lVar18 = (long)rgb_stride;
              do {
                bVar1 = puVar28[lVar18];
                bVar2 = local_1b0[lVar18];
                bVar3 = local_1d0[lVar18];
                if (rg == (VP8Random *)0x0) {
                  iVar12 = (uint)bVar3 * 0x1914 + (uint)bVar2 * 0x8123 + (uint)bVar1 * 0x41c7;
                }
                else {
                  uVar8 = puVar25[rg->index1];
                  uVar9 = puVar25[rg->index2];
                  iVar12 = rg->amp;
                  puVar25[rg->index1] = uVar8 - uVar9 & 0x7fffffff;
                  iVar23 = rg->index1 + 1;
                  if (iVar23 == 0x37) {
                    iVar23 = 0;
                  }
                  rg->index1 = iVar23;
                  iVar23 = rg->index2 + 1;
                  if (iVar23 == 0x37) {
                    iVar23 = 0;
                  }
                  rg->index2 = iVar23;
                  iVar12 = (uint)bVar3 * 0x1914 + (uint)bVar2 * 0x8123 + (uint)bVar1 * 0x41c7 +
                           ((short)(uVar8 - uVar9 >> 0xf) * iVar12 >> 8);
                }
                local_198[uVar17 + (long)iVar20] = (uint8_t)((uint)(iVar12 + 0x108000) >> 0x10);
                uVar17 = uVar17 + 1;
                lVar18 = lVar18 + step;
              } while (uVar22 != uVar17);
            }
          }
          else {
            puVar19 = local_1d0;
            if (r_ptr < b_ptr) {
              puVar19 = puVar28;
            }
            (**pp_Var16)(puVar19,local_198,width);
            (**pp_Var16)(puVar19 + rgb_stride,local_198 + picture->y_stride,width);
          }
          iVar20 = picture->y_stride;
          if (bVar29) {
LAB_0012aaea:
            AccumulateRGB(puVar28,local_1b0,local_1d0,step,rgb_stride,dst,width);
          }
          else {
            iVar12 = (*WebPExtractAlpha)(local_1b8,rgb_stride,width,2,local_160,picture->a_stride);
            local_160 = local_160 + (long)picture->a_stride * 2;
            if (iVar12 != 0) goto LAB_0012aaea;
            AccumulateRGBA(puVar28,local_1b0,local_1d0,local_1b8,rgb_stride,dst,width);
          }
          if (rg == (VP8Random *)0x0) {
            (*WebPConvertRGBA32ToUV)(dst,local_168,local_190,uVar14);
          }
          else if (0 < (int)uVar14) {
            uVar17 = 0;
            do {
              uVar4 = dst[uVar17 * 4];
              uVar5 = dst[uVar17 * 4 + 1];
              uVar6 = dst[uVar17 * 4 + 2];
              uVar8 = puVar25[rg->index1];
              uVar9 = puVar25[rg->index2];
              iVar12 = rg->amp;
              puVar25[rg->index1] = uVar8 - uVar9 & 0x7fffffff;
              iVar23 = rg->index1 + 1;
              if (iVar23 == 0x37) {
                iVar23 = 0;
              }
              iVar24 = rg->index2 + 1;
              if (iVar24 == 0x37) {
                iVar24 = 0;
              }
              rg->index1 = iVar23;
              rg->index2 = iVar24;
              iVar12 = (uint)uVar6 * 0x7080 + (uint)uVar5 * -0x4a89 + (uint)uVar4 * -0x25f7 +
                       0x2020000 + (((int)((uVar8 - uVar9) * 2) >> 0xe) * iVar12 >> 8);
              if (iVar12 >> 0x12 < 1) {
                iVar12 = 0;
              }
              iVar12 = iVar12 >> 0x12;
              if (0xfe < iVar12) {
                iVar12 = 0xff;
              }
              local_168[uVar17] = (uint8_t)iVar12;
              uVar8 = puVar25[rg->index1];
              uVar9 = puVar25[rg->index2];
              iVar12 = rg->amp;
              puVar25[rg->index1] = uVar8 - uVar9 & 0x7fffffff;
              iVar23 = rg->index1 + 1;
              if (iVar23 == 0x37) {
                iVar23 = 0;
              }
              iVar24 = rg->index2 + 1;
              if (iVar24 == 0x37) {
                iVar24 = 0;
              }
              rg->index1 = iVar23;
              rg->index2 = iVar24;
              iVar12 = (uint)uVar6 * -0x124c + (uint)uVar5 * -0x5e34 + (uint)uVar4 * 0x7080 +
                       0x2020000 + (((int)((uVar8 - uVar9) * 2) >> 0xe) * iVar12 >> 8);
              if (iVar12 >> 0x12 < 1) {
                iVar12 = 0;
              }
              iVar12 = iVar12 >> 0x12;
              if (0xfe < iVar12) {
                iVar12 = 0xff;
              }
              local_190[uVar17] = (uint8_t)iVar12;
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
          }
          local_198 = local_198 + (long)iVar20 * 2;
          local_168 = local_168 + picture->uv_stride;
          local_190 = local_190 + picture->uv_stride;
          puVar28 = puVar28 + lVar15;
          local_1d0 = local_1d0 + lVar15;
          local_1b0 = local_1b0 + lVar15;
          local_1b8 = local_1b8 + lVar21;
          iVar13 = iVar13 + 1;
        } while (iVar13 != (int)uVar7 >> 1);
      }
      if ((uVar7 & 1) != 0) {
        if (!bVar10 || step != 3) {
          if (0 < (int)width) {
            uVar17 = 0;
            lVar21 = 0;
            do {
              bVar1 = puVar28[lVar21];
              bVar2 = local_1b0[lVar21];
              bVar3 = local_1d0[lVar21];
              if (rg == (VP8Random *)0x0) {
                iVar13 = (uint)bVar3 * 0x1914 + (uint)bVar2 * 0x8123 + (uint)bVar1 * 0x41c7;
              }
              else {
                uVar8 = puVar25[rg->index1];
                uVar9 = puVar25[rg->index2];
                iVar13 = rg->amp;
                puVar25[rg->index1] = uVar8 - uVar9 & 0x7fffffff;
                iVar20 = rg->index1 + 1;
                if (iVar20 == 0x37) {
                  iVar20 = 0;
                }
                rg->index1 = iVar20;
                iVar20 = rg->index2 + 1;
                if (iVar20 == 0x37) {
                  iVar20 = 0;
                }
                rg->index2 = iVar20;
                iVar13 = (uint)bVar3 * 0x1914 + (uint)bVar2 * 0x8123 + (uint)bVar1 * 0x41c7 +
                         ((short)(uVar8 - uVar9 >> 0xf) * iVar13 >> 8);
              }
              local_198[uVar17] = (uint8_t)((uint)(iVar13 + 0x108000) >> 0x10);
              uVar17 = uVar17 + 1;
              lVar21 = lVar21 + step;
            } while (uVar22 != uVar17);
          }
        }
        else {
          puVar19 = local_1d0;
          if (puVar28 < local_1d0) {
            puVar19 = puVar28;
          }
          pp_Var16 = &WebPConvertBGR24ToY;
          if (puVar28 < local_1d0) {
            pp_Var16 = &WebPConvertRGB24ToY;
          }
          (**pp_Var16)(puVar19,local_198,width);
        }
        if ((bVar29) || (iVar13 = (*WebPExtractAlpha)(local_1b8,0,width,1,local_160,0), iVar13 != 0)
           ) {
          AccumulateRGB(puVar28,local_1b0,local_1d0,step,0,dst,width);
        }
        else {
          AccumulateRGBA(puVar28,local_1b0,local_1d0,local_1b8,0,dst,width);
        }
        if (rg == (VP8Random *)0x0) {
          (*WebPConvertRGBA32ToUV)(dst,local_168,local_190,uVar14);
        }
        else if (0 < (int)uVar14) {
          uVar22 = 0;
          do {
            uVar4 = dst[uVar22 * 4];
            uVar5 = dst[uVar22 * 4 + 1];
            uVar6 = dst[uVar22 * 4 + 2];
            uVar8 = puVar25[rg->index1];
            uVar9 = puVar25[rg->index2];
            iVar13 = rg->amp;
            puVar25[rg->index1] = uVar8 - uVar9 & 0x7fffffff;
            iVar20 = rg->index1 + 1;
            if (iVar20 == 0x37) {
              iVar20 = 0;
            }
            iVar12 = rg->index2 + 1;
            if (iVar12 == 0x37) {
              iVar12 = 0;
            }
            rg->index1 = iVar20;
            rg->index2 = iVar12;
            iVar13 = (uint)uVar6 * 0x7080 + (uint)uVar5 * -0x4a89 + (uint)uVar4 * -0x25f7 +
                     0x2020000 + (((int)((uVar8 - uVar9) * 2) >> 0xe) * iVar13 >> 8);
            if (iVar13 >> 0x12 < 1) {
              iVar13 = 0;
            }
            iVar13 = iVar13 >> 0x12;
            if (0xfe < iVar13) {
              iVar13 = 0xff;
            }
            local_168[uVar22] = (uint8_t)iVar13;
            uVar8 = puVar25[rg->index1];
            uVar9 = puVar25[rg->index2];
            iVar13 = rg->amp;
            puVar25[rg->index1] = uVar8 - uVar9 & 0x7fffffff;
            iVar20 = rg->index1 + 1;
            if (iVar20 == 0x37) {
              iVar20 = 0;
            }
            iVar12 = rg->index2 + 1;
            if (iVar12 == 0x37) {
              iVar12 = 0;
            }
            rg->index1 = iVar20;
            rg->index2 = iVar12;
            iVar13 = (uint)uVar6 * -0x124c + (uint)uVar5 * -0x5e34 + (uint)uVar4 * 0x7080 +
                     0x2020000 + (((int)((uVar8 - uVar9) * 2) >> 0xe) * iVar13 >> 8);
            if (iVar13 >> 0x12 < 1) {
              iVar13 = 0;
            }
            iVar13 = iVar13 >> 0x12;
            if (0xfe < iVar13) {
              iVar13 = 0xff;
            }
            local_190[uVar22] = (uint8_t)iVar13;
            uVar22 = uVar22 + 1;
          } while (uVar14 != uVar22);
        }
      }
      WebPSafeFree(dst);
    }
    else {
      SharpYuvInit(VP8GetCPUInfo);
      puVar28 = picture->y;
      iVar13 = picture->y_stride;
      puVar19 = picture->u;
      iVar20 = picture->uv_stride;
      v_ptr = picture->v;
      iVar12 = picture->width;
      iVar23 = picture->height;
      yuv_matrix = SharpYuvGetConversionMatrix(kSharpYuvMatrixWebp);
      iVar13 = SharpYuvConvert(r_ptr,g_ptr,b_ptr,step,rgb_stride,8,puVar28,iVar13,puVar19,iVar20,
                               v_ptr,iVar20,8,iVar12,iVar23,yuv_matrix);
      if (iVar13 == 0) {
        iVar13 = WebPEncodingSetError(picture,VP8_ENC_ERROR_OUT_OF_MEMORY);
        if (bVar29 || iVar13 == 0) {
          return (uint)(iVar13 != 0);
        }
      }
      else if (bVar29) {
        return 1;
      }
      (*WebPExtractAlpha)(a_ptr,rgb_stride,width,uVar7,picture->a,picture->a_stride);
    }
    iVar13 = 1;
  }
  return iVar13;
}

Assistant:

static int ImportYUVAFromRGBA(const uint8_t* r_ptr,
                              const uint8_t* g_ptr,
                              const uint8_t* b_ptr,
                              const uint8_t* a_ptr,
                              int step,         // bytes per pixel
                              int rgb_stride,   // bytes per scanline
                              float dithering,
                              int use_iterative_conversion,
                              WebPPicture* const picture) {
  int y;
  const int width = picture->width;
  const int height = picture->height;
  const int has_alpha = CheckNonOpaque(a_ptr, width, height, step, rgb_stride);
  const int is_rgb = (r_ptr < b_ptr);  // otherwise it's bgr

  picture->colorspace = has_alpha ? WEBP_YUV420A : WEBP_YUV420;
  picture->use_argb = 0;

  // disable smart conversion if source is too small (overkill).
  if (width < kMinDimensionIterativeConversion ||
      height < kMinDimensionIterativeConversion) {
    use_iterative_conversion = 0;
  }

  if (!WebPPictureAllocYUVA(picture)) {
    return 0;
  }
  if (has_alpha) {
    assert(step == 4);
#if defined(USE_GAMMA_COMPRESSION) && defined(USE_INVERSE_ALPHA_TABLE)
    assert(kAlphaFix + GAMMA_FIX <= 31);
#endif
  }

  if (use_iterative_conversion) {
    SharpYuvInit(VP8GetCPUInfo);
    if (!PreprocessARGB(r_ptr, g_ptr, b_ptr, step, rgb_stride, picture)) {
      return 0;
    }
    if (has_alpha) {
      WebPExtractAlpha(a_ptr, rgb_stride, width, height,
                       picture->a, picture->a_stride);
    }
  } else {
    const int uv_width = (width + 1) >> 1;
    int use_dsp = (step == 3);  // use special function in this case
    // temporary storage for accumulated R/G/B values during conversion to U/V
    uint16_t* const tmp_rgb =
        (uint16_t*)WebPSafeMalloc(4 * uv_width, sizeof(*tmp_rgb));
    uint8_t* dst_y = picture->y;
    uint8_t* dst_u = picture->u;
    uint8_t* dst_v = picture->v;
    uint8_t* dst_a = picture->a;

    VP8Random base_rg;
    VP8Random* rg = NULL;
    if (dithering > 0.) {
      VP8InitRandom(&base_rg, dithering);
      rg = &base_rg;
      use_dsp = 0;   // can't use dsp in this case
    }
    WebPInitConvertARGBToYUV();
    InitGammaTables();

    if (tmp_rgb == NULL) {
      return WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    }

    // Downsample Y/U/V planes, two rows at a time
    for (y = 0; y < (height >> 1); ++y) {
      int rows_have_alpha = has_alpha;
      if (use_dsp) {
        if (is_rgb) {
          WebPConvertRGB24ToY(r_ptr, dst_y, width);
          WebPConvertRGB24ToY(r_ptr + rgb_stride,
                              dst_y + picture->y_stride, width);
        } else {
          WebPConvertBGR24ToY(b_ptr, dst_y, width);
          WebPConvertBGR24ToY(b_ptr + rgb_stride,
                              dst_y + picture->y_stride, width);
        }
      } else {
        ConvertRowToY(r_ptr, g_ptr, b_ptr, step, dst_y, width, rg);
        ConvertRowToY(r_ptr + rgb_stride,
                      g_ptr + rgb_stride,
                      b_ptr + rgb_stride, step,
                      dst_y + picture->y_stride, width, rg);
      }
      dst_y += 2 * picture->y_stride;
      if (has_alpha) {
        rows_have_alpha &= !WebPExtractAlpha(a_ptr, rgb_stride, width, 2,
                                             dst_a, picture->a_stride);
        dst_a += 2 * picture->a_stride;
      }
      // Collect averaged R/G/B(/A)
      if (!rows_have_alpha) {
        AccumulateRGB(r_ptr, g_ptr, b_ptr, step, rgb_stride, tmp_rgb, width);
      } else {
        AccumulateRGBA(r_ptr, g_ptr, b_ptr, a_ptr, rgb_stride, tmp_rgb, width);
      }
      // Convert to U/V
      if (rg == NULL) {
        WebPConvertRGBA32ToUV(tmp_rgb, dst_u, dst_v, uv_width);
      } else {
        ConvertRowsToUV(tmp_rgb, dst_u, dst_v, uv_width, rg);
      }
      dst_u += picture->uv_stride;
      dst_v += picture->uv_stride;
      r_ptr += 2 * rgb_stride;
      b_ptr += 2 * rgb_stride;
      g_ptr += 2 * rgb_stride;
      if (has_alpha) a_ptr += 2 * rgb_stride;
    }
    if (height & 1) {    // extra last row
      int row_has_alpha = has_alpha;
      if (use_dsp) {
        if (r_ptr < b_ptr) {
          WebPConvertRGB24ToY(r_ptr, dst_y, width);
        } else {
          WebPConvertBGR24ToY(b_ptr, dst_y, width);
        }
      } else {
        ConvertRowToY(r_ptr, g_ptr, b_ptr, step, dst_y, width, rg);
      }
      if (row_has_alpha) {
        row_has_alpha &= !WebPExtractAlpha(a_ptr, 0, width, 1, dst_a, 0);
      }
      // Collect averaged R/G/B(/A)
      if (!row_has_alpha) {
        // Collect averaged R/G/B
        AccumulateRGB(r_ptr, g_ptr, b_ptr, step, /* rgb_stride = */ 0,
                      tmp_rgb, width);
      } else {
        AccumulateRGBA(r_ptr, g_ptr, b_ptr, a_ptr, /* rgb_stride = */ 0,
                       tmp_rgb, width);
      }
      if (rg == NULL) {
        WebPConvertRGBA32ToUV(tmp_rgb, dst_u, dst_v, uv_width);
      } else {
        ConvertRowsToUV(tmp_rgb, dst_u, dst_v, uv_width, rg);
      }
    }
    WebPSafeFree(tmp_rgb);
  }
  return 1;
}